

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekf_f
          (AttitudeQuaternionEKF *this,VectorDynSize *x_k,VectorDynSize *u_k,
          VectorDynSize *xhat_k_plus_one)

{
  bool bVar1;
  RealScalar RVar2;
  Vector3 omega;
  long lVar3;
  long lVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x_hat_plus;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> b;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> u;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Omega;
  Vector3 ang_vel;
  Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> q;
  UnitQuaternion orientation;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x;
  Vector3 gyro_bias;
  UnitQuaternion q_hat_plus;
  UnitQuaternion correction;
  PointerType local_1c8;
  long lStackY_1c0;
  undefined1 local_1b8;
  double *pdVar8;
  undefined2 in_stack_fffffffffffffe58;
  undefined6 in_stack_fffffffffffffe5a;
  PointerType in_stack_fffffffffffffe60;
  variable_if_dynamic<long,__1> vStack_198;
  undefined1 *local_188 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_178;
  undefined1 local_120 [24];
  undefined1 local_108 [56];
  UnitQuaternion *local_d0 [2];
  UnitQuaternion local_c0;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_a0;
  double local_88 [3];
  UnitQuaternion local_70;
  UnitQuaternion local_50;
  
  lVar3 = iDynTree::VectorDynSize::size();
  lVar4 = iDynTree::VectorDynSize::size();
  if (lVar3 == lVar4) {
    lVar3 = iDynTree::VectorDynSize::size();
    lVar4 = iDynTree::VectorDynSize::size();
    if (lVar3 == lVar4) {
      lVar3 = iDynTree::VectorDynSize::size();
      lVar4 = iDynTree::VectorDynSize::size();
      if (lVar3 == lVar4) {
        local_d0[0] = &local_c0;
        local_188[0] = local_120;
        pdVar8 = local_88;
        toEigen(&local_a0,x_k);
        toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                &stack0xfffffffffffffe60,u_k);
        toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1c8,
                xhat_k_plus_one);
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
        .m_data = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value =
             local_a0.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        ._16_1_ = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  ._16_1_;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_startRow.m_value = 0;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_outerStride =
             local_a0.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,4,1,false>>
                  ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_d0,
                   (Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>
                    *)&local_178);
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
        .m_data = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data + 4;
        local_178.m_rhs.m_functor.m_other = (this->m_params_qekf).time_step_in_seconds;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value =
             local_a0.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        ._16_1_ = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  ._16_1_;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_startRow.m_value = 4;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_outerStride =
             local_a0.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                  ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_188,
                   &local_178);
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
        .m_data = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data + 7;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value =
             local_a0.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        ._16_1_ = local_a0.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  ._16_1_;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_startRow.m_value = 7;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_outerStride =
             local_a0.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,3,1,false>>
                  ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   &stack0xfffffffffffffe50,&local_178.m_lhs);
        omega.m_data[1]._0_2_ = in_stack_fffffffffffffe58;
        omega.m_data[0] = (double)pdVar8;
        omega.m_data[1]._2_2_ = SUB62(in_stack_fffffffffffffe5a,0);
        omega.m_data[1]._4_4_ = SUB64(in_stack_fffffffffffffe5a,2);
        omega.m_data[2] = (double)in_stack_fffffffffffffe60;
        expQuaternion(omega);
        composeQuaternion2(&local_70,&local_c0,&local_50);
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
        .m_data = local_1c8;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_1c8;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = lStackY_1c0;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        ._16_1_ = local_1b8;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_startRow.m_value = 0;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_outerStride = lStackY_1c0;
        local_108._0_8_ = &local_70;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,4,1,false>,Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>>
                  ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>
                    *)&local_178,
                   (Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_108);
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
        .m_data = local_1c8;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = local_1c8;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = lStackY_1c0;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_xpr.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        ._16_1_ = local_1b8;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_startRow.m_value = 0;
        local_178.m_lhs.
        super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
        .m_outerStride = lStackY_1c0;
        RVar2 = Eigen::
                MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>_>
                ::norm((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>_>
                        *)&local_178);
        dVar6 = ABS(RVar2);
        bVar1 = dVar6 * 2.220446049250313e-16 * 4.0 < dVar6;
        if (bVar1) {
          dVar7 = 1.0;
          if (1.0 <= dVar6) {
            dVar7 = dVar6;
          }
          if (dVar7 * 2.220446049250313e-16 * 4.0 < ABS(RVar2 + -1.0)) {
            local_178.m_lhs.
            super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
            .m_data = local_1c8;
            local_178.m_lhs.
            super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
            .m_xpr.
            super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data = local_1c8;
            local_178.m_lhs.
            super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
            .m_xpr.
            super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value = lStackY_1c0;
            local_178.m_lhs.
            super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
            .m_xpr.
            super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
            ._16_1_ = local_1b8;
            local_178.m_lhs.
            super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
            .m_startRow.m_value = 0;
            local_178.m_lhs.
            super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
            .m_outerStride = lStackY_1c0;
            Eigen::
            MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>_>
            ::normalize((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>_>
                         *)&local_178);
          }
          local_108._8_8_ = vStack_198.m_value;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
          .m_data = local_1c8 + 4;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_1c8;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value = lStackY_1c0;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_1_ = local_1b8;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_startRow.m_value = 4;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_outerStride = lStackY_1c0;
          local_108._24_8_ = pdVar8;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
                    ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                      *)&local_178,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)local_108);
          local_108._24_8_ =
               1.0 - (this->m_params_qekf).bias_correlation_time_factor *
                     (this->m_params_qekf).time_step_in_seconds;
          local_108._8_2_ = in_stack_fffffffffffffe58;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
          .m_data = local_1c8 + 7;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_1c8;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value = lStackY_1c0;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_1_ = local_1b8;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_startRow.m_value = 7;
          local_178.m_lhs.
          super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
          .m_outerStride = lStackY_1c0;
          local_108._0_8_ = pdVar8;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                    ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                      *)&local_178,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)local_108);
          return bVar1;
        }
        iDynTree::reportError("AttitudeQuaternionEKF","ekf_f","invalid quaternion");
        return bVar1;
      }
      pcVar5 = "input size mismatch";
      goto LAB_001dc191;
    }
  }
  pcVar5 = "state size mismatch";
LAB_001dc191:
  iDynTree::reportError("AttitudeQuaternionEKF","ekf_f",pcVar5);
  return false;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekf_f(const iDynTree::VectorDynSize& x_k, const iDynTree::VectorDynSize& u_k, iDynTree::VectorDynSize& xhat_k_plus_one)
{
    if (x_k.size() != m_x.size() || xhat_k_plus_one.size() != m_x.size())
    {
        reportError("AttitudeQuaternionEKF", "ekf_f", "state size mismatch");
        return false;
    }

    if (u_k.size() != m_u.size())
    {
        reportError("AttitudeQuaternionEKF", "ekf_f", "input size mismatch");
        return false;
    }

    iDynTree::UnitQuaternion orientation;
    iDynTree::Vector3 ang_vel, gyro_bias;

    using iDynTree::toEigen;
    auto q(toEigen(orientation));
    auto Omega(toEigen(ang_vel));
    auto b(toEigen(gyro_bias));
    auto x(toEigen(x_k));
    auto u(toEigen(u_k));
    auto x_hat_plus(toEigen(xhat_k_plus_one));

    q = x.block<4,1>(0, 0);
    Omega = x.block<3,1>(4, 0)*m_params_qekf.time_step_in_seconds;
    b = x.block<3,1>(7, 0);

    iDynTree::UnitQuaternion correction = expQuaternion(ang_vel);
    iDynTree::UnitQuaternion q_hat_plus = composeQuaternion2(orientation, correction);

    x_hat_plus.block<4,1>(0, 0) = toEigen(q_hat_plus);
    double quat_norm = x_hat_plus.block<4,1>(0, 0).norm();

    double malformed_unit_quaternion_norm{0.0};
    if (check_are_almost_equal(quat_norm, malformed_unit_quaternion_norm, 4))
    {
        reportError("AttitudeQuaternionEKF", "ekf_f", "invalid quaternion");
        return false;
    }

    double unit_quaternion_norm{1.0};
    if (!check_are_almost_equal(quat_norm, unit_quaternion_norm, 4))
    {
        x_hat_plus.block<4,1>(0, 0).normalize();
    }
    x_hat_plus.block<3,1>(4, 0) = u - b;
    x_hat_plus.block<3,1>(7, 0) = b*(1 - (m_params_qekf.bias_correlation_time_factor*m_params_qekf.time_step_in_seconds));

    return true;
}